

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall draco::ObjEncoder::EncodeFaceCorner(ObjEncoder *this,PointIndex vert_index)

{
  EncoderBuffer *pEVar1;
  PointAttribute *pPVar2;
  undefined8 in_RAX;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> IVar3;
  PointIndex PVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  
  pEVar1 = this->out_buffer_;
  if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)pEVar1,
               (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&stack0xffffffffffffffef,&stack0xfffffffffffffff0,
               in_R8,in_R9,CONCAT17(0x20,(int7)in_RAX));
  }
  IVar3.value_ = vert_index.value_;
  if (this->pos_att_->identity_mapping_ == false) {
    IVar3.value_ = (this->pos_att_->indices_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[vert_index.value_].value_;
  }
  EncodeInt(this,IVar3.value_ + 1);
  if (this->normal_att_ != (PointAttribute *)0x0 || this->tex_coord_att_ != (PointAttribute *)0x0) {
    pEVar1 = this->out_buffer_;
    if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)pEVar1,
                 (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&stack0xffffffffffffffee,&stack0xffffffffffffffef
                );
    }
    pPVar2 = this->tex_coord_att_;
    if (pPVar2 != (PointAttribute *)0x0) {
      PVar4.value_ = vert_index.value_;
      if (pPVar2->identity_mapping_ == false) {
        PVar4.value_ = (pPVar2->indices_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[vert_index.value_].value_;
      }
      EncodeInt(this,PVar4.value_ + 1);
    }
    if (this->normal_att_ != (PointAttribute *)0x0) {
      pEVar1 = this->out_buffer_;
      if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar1,
                   (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&stack0xffffffffffffffed,
                   &stack0xffffffffffffffee);
      }
      if (this->normal_att_->identity_mapping_ == false) {
        vert_index.value_ =
             (this->normal_att_->indices_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[vert_index.value_].value_;
      }
      EncodeInt(this,vert_index.value_ + 1);
    }
  }
  return true;
}

Assistant:

bool ObjEncoder::EncodeFaceCorner(PointIndex vert_index) {
  buffer()->Encode(' ');
  // Note that in the OBJ format, all indices are encoded starting from index 1.
  // Encode position index.
  EncodeInt(pos_att_->mapped_index(vert_index).value() + 1);
  if (tex_coord_att_ || normal_att_) {
    // Encoding format is pos_index/tex_coord_index/normal_index.
    // If tex_coords are not present, we must encode pos_index//normal_index.
    buffer()->Encode('/');
    if (tex_coord_att_) {
      EncodeInt(tex_coord_att_->mapped_index(vert_index).value() + 1);
    }
    if (normal_att_) {
      buffer()->Encode('/');
      EncodeInt(normal_att_->mapped_index(vert_index).value() + 1);
    }
  }
  return true;
}